

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac_.c
# Opt level: O2

void qrfac_(int *m,int *n,double *a,int *lda,int *pivot,int *ipvt,int *lipvt,double *rdiag,
           double *acnorm,double *wa)

{
  double *x;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  uint *puVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  uint local_dc;
  ulong local_d8;
  uint *local_d0;
  int *local_c8;
  uint local_bc;
  int local_b8;
  uint local_b4;
  double *local_b0;
  long local_a8;
  long local_a0;
  double *local_98;
  uint *local_90;
  int *local_88;
  double *local_80;
  ulong local_78;
  long local_70;
  double *local_68;
  double local_60;
  double *local_58;
  int c__1;
  double local_48;
  
  c__1 = 1;
  lVar18 = (long)*lda;
  uVar9 = (ulong)~*lda;
  local_b0 = a + uVar9;
  local_d0 = (uint *)m;
  local_c8 = pivot;
  local_88 = ipvt;
  local_60 = dpmpar_(&c__1);
  uVar19 = 0;
  uVar11 = (ulong)(uint)*n;
  if (*n < 1) {
    uVar11 = uVar19;
  }
  local_a8 = lVar18 * 8;
  pdVar10 = a + lVar18 + uVar9 + 1;
  local_d8 = uVar9;
  local_a0 = lVar18;
  local_98 = a;
  local_90 = (uint *)n;
  for (; uVar11 != uVar19; uVar19 = uVar19 + 1) {
    dVar21 = enorm_((int *)local_d0,pdVar10);
    acnorm[uVar19] = dVar21;
    rdiag[uVar19] = dVar21;
    wa[uVar19] = dVar21;
    if (*local_c8 != 0) {
      local_88[uVar19] = (int)uVar19 + 1;
    }
    pdVar10 = (double *)((long)pdVar10 + local_a8);
  }
  local_bc = *local_90;
  if ((int)*local_d0 < (int)*local_90) {
    local_bc = *local_d0;
  }
  if ((int)local_bc < 1) {
    local_bc = 0;
  }
  local_80 = local_98 + local_d8 + 1;
  local_70 = local_a0 * 8 + 8;
  local_b8 = 2;
  uVar11 = 1;
  piVar13 = local_c8;
  puVar14 = local_d0;
  lVar18 = local_a0;
  lVar15 = local_a8;
  pdVar10 = local_b0;
  uVar7 = local_bc;
  for (uVar17 = 0; uVar17 != uVar7; uVar17 = uVar17 + 1) {
    if (*piVar13 != 0) {
      uVar1 = *local_90;
      if ((int)*local_90 <= (int)uVar17) {
        uVar1 = uVar17;
      }
      uVar19 = uVar11 & 0xffffffff;
      uVar9 = uVar11;
      while( true ) {
        uVar4 = (uint)uVar19;
        if ((ulong)uVar1 + 1 == uVar9) break;
        uVar2 = (uint)uVar9;
        if (rdiag[uVar9 - 1] < rdiag[(long)(int)uVar4 + -1] ||
            rdiag[uVar9 - 1] == rdiag[(long)(int)uVar4 + -1]) {
          uVar2 = uVar4;
        }
        uVar9 = uVar9 + 1;
        uVar19 = (ulong)uVar2;
      }
      if (uVar11 != uVar19) {
        iVar5 = uVar4 * (int)lVar18;
        uVar9 = (ulong)*puVar14;
        if ((int)*puVar14 < 1) {
          uVar9 = 0;
        }
        for (uVar19 = 0; uVar9 != uVar19; uVar19 = uVar19 + 1) {
          dVar21 = *(double *)((long)local_80 + uVar19 * 8 + lVar15 * uVar11);
          *(double *)((long)local_80 + uVar19 * 8 + lVar15 * uVar11) =
               local_80[(long)iVar5 + uVar19];
          local_80[(long)iVar5 + uVar19] = dVar21;
        }
        rdiag[(long)(int)uVar4 + -1] = rdiag[uVar11 - 1];
        wa[(long)(int)uVar4 + -1] = wa[uVar11 - 1];
        iVar5 = local_88[uVar11 - 1];
        local_88[uVar11 - 1] = local_88[(long)(int)uVar4 + -1];
        local_88[(long)(int)uVar4 + -1] = iVar5;
      }
    }
    local_dc = (*puVar14 - (int)uVar11) + 1;
    x = pdVar10 + uVar11 * lVar18 + uVar11;
    dVar21 = enorm_((int *)&local_dc,x);
    uVar9 = uVar11;
    piVar13 = local_c8;
    puVar14 = local_d0;
    lVar18 = local_a0;
    lVar15 = local_a8;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      lVar8 = (long)local_b8;
      dVar21 = (double)(~-(ulong)(*x < 0.0) & (ulong)dVar21 | (ulong)-dVar21 & -(ulong)(*x < 0.0));
      lVar16 = local_70 * uVar11;
      uVar7 = *local_d0;
      if ((int)*local_d0 <= (int)uVar17) {
        uVar7 = uVar17;
      }
      for (lVar6 = 0; (uVar7 - uVar11) + 1 != lVar6; lVar6 = lVar6 + 1) {
        *(double *)((long)pdVar10 + lVar6 * 8 + lVar16) =
             *(double *)((long)pdVar10 + lVar6 * 8 + lVar16) / dVar21;
      }
      *x = *x + 1.0;
      uVar19 = uVar11 + 1;
      local_dc = *local_90;
      uVar3 = (ulong)(int)local_dc;
      pdVar20 = local_b0;
      local_d8 = uVar11;
      local_98 = x;
      uVar7 = local_bc;
      if ((long)uVar11 < (long)uVar3) {
        local_58 = local_b0 + uVar11;
        local_68 = local_b0 + uVar19;
        lVar6 = local_a8 * lVar8 + uVar11 * 8 + (long)local_b0;
        local_78 = uVar19;
        local_48 = dVar21;
        for (; uVar19 = local_78, uVar9 = local_d8, pdVar20 = local_b0, uVar7 = local_bc,
            lVar8 <= (int)uVar3; lVar8 = lVar8 + 1) {
          local_b4 = *puVar14;
          uVar7 = uVar17;
          if ((int)uVar17 < (int)local_b4) {
            uVar7 = local_b4;
          }
          dVar22 = 0.0;
          for (lVar12 = 0; (ulong)uVar7 + (1 - uVar11) != lVar12; lVar12 = lVar12 + 1) {
            dVar22 = dVar22 + *(double *)((long)pdVar10 + lVar12 * 8 + lVar16) *
                              *(double *)(lVar6 + lVar12 * 8);
          }
          dVar23 = *local_98;
          uVar7 = uVar17;
          if ((int)uVar17 < (int)local_b4) {
            uVar7 = local_b4;
          }
          for (lVar12 = 0; (ulong)uVar7 + (1 - uVar11) != lVar12; lVar12 = lVar12 + 1) {
            *(double *)(lVar6 + lVar12 * 8) =
                 *(double *)((long)pdVar10 + lVar12 * 8 + lVar16) * (-dVar22 / dVar23) +
                 *(double *)(lVar6 + lVar12 * 8);
          }
          if (*piVar13 != 0) {
            dVar22 = rdiag[lVar8 + -1];
            if (((dVar22 != 0.0) || (NAN(dVar22))) &&
               (dVar23 = 1.0 - (local_58[lVar8 * lVar18] / dVar22) *
                               (local_58[lVar8 * lVar18] / dVar22),
               dVar22 = SQRT((double)(~-(ulong)(dVar23 <= 0.0) & (ulong)dVar23)) * dVar22,
               rdiag[lVar8 + -1] = dVar22, dVar22 = dVar22 / wa[lVar8 + -1],
               dVar22 * dVar22 * 0.05 <= local_60)) {
              local_b4 = local_b4 - (int)local_d8;
              dVar21 = enorm_((int *)&local_b4,local_68 + lVar8 * lVar18);
              rdiag[lVar8 + -1] = dVar21;
              wa[lVar8 + -1] = dVar21;
              uVar3 = (ulong)local_dc;
              piVar13 = local_c8;
              puVar14 = local_d0;
              lVar18 = local_a0;
              lVar15 = local_a8;
              dVar21 = local_48;
            }
          }
          lVar6 = lVar6 + lVar15;
        }
      }
    }
    else {
      uVar19 = uVar11 + 1;
      pdVar20 = pdVar10;
    }
    rdiag[uVar9 - 1] = -dVar21;
    local_b8 = local_b8 + 1;
    uVar11 = uVar19;
    pdVar10 = pdVar20;
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(qrfac)(const int *m, const int *n, real *a, const int *
	lda, const int *pivot, int *ipvt, const int *lipvt, real *rdiag,
	 real *acnorm, real *wa)
{
    /* Initialized data */

#define p05 .05
    const int c__1 = 1;

    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3;
    real d__1, d__2, d__3;

    /* Local variables */
    int i__, j, k, jp1;
    real sum;
    int kmax;
    real temp;
    int minmn;
    real epsmch;
    real ajnorm;

/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa;
    --acnorm;
    --rdiag;
    a_dim1 = *lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;
    --ipvt;
    (void)lipvt;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

/*     compute the initial column norms and initialize several arrays. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	acnorm[j] = __minpack_func__(enorm)(m, &a[j * a_dim1 + 1]);
	rdiag[j] = acnorm[j];
	wa[j] = rdiag[j];
	if (*pivot) {
	    ipvt[j] = j;
	}
/* L10: */
    }

/*     reduce a to r with householder transformations. */

    minmn = min(*m,*n);
    i__1 = minmn;
    for (j = 1; j <= i__1; ++j) {
	if (! (*pivot)) {
	    goto L40;
	}

/*        bring the column of largest norm into the pivot position. */

	kmax = j;
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
	    if (rdiag[k] > rdiag[kmax]) {
		kmax = k;
	    }
/* L20: */
	}
	if (kmax == j) {
	    goto L40;
	}
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    temp = a[i__ + j * a_dim1];
	    a[i__ + j * a_dim1] = a[i__ + kmax * a_dim1];
	    a[i__ + kmax * a_dim1] = temp;
/* L30: */
	}
	rdiag[kmax] = rdiag[j];
	wa[kmax] = wa[j];
	k = ipvt[j];
	ipvt[j] = ipvt[kmax];
	ipvt[kmax] = k;
L40:

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

	i__2 = *m - j + 1;
	ajnorm = __minpack_func__(enorm)(&i__2, &a[j + j * a_dim1]);
	if (ajnorm == 0.) {
	    goto L100;
	}
	if (a[j + j * a_dim1] < 0.) {
	    ajnorm = -ajnorm;
	}
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    a[i__ + j * a_dim1] /= ajnorm;
/* L50: */
	}
	a[j + j * a_dim1] += 1;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

	jp1 = j + 1;
	if (*n < jp1) {
	    goto L100;
	}
	i__2 = *n;
	for (k = jp1; k <= i__2; ++k) {
	    sum = 0.;
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		sum += a[i__ + j * a_dim1] * a[i__ + k * a_dim1];
/* L60: */
	    }
	    temp = sum / a[j + j * a_dim1];
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		a[i__ + k * a_dim1] -= temp * a[i__ + j * a_dim1];
/* L70: */
	    }
	    if (! (*pivot) || rdiag[k] == 0.) {
		goto L80;
	    }
	    temp = a[j + k * a_dim1] / rdiag[k];
/* Computing MAX */
/* Computing 2nd power */
	    d__3 = temp;
	    d__1 = 0., d__2 = 1 - d__3 * d__3;
	    rdiag[k] *= sqrt((max(d__1,d__2)));
/* Computing 2nd power */
	    d__1 = rdiag[k] / wa[k];
	    if (p05 * (d__1 * d__1) > epsmch) {
		goto L80;
	    }
	    i__3 = *m - j;
	    rdiag[k] = __minpack_func__(enorm)(&i__3, &a[jp1 + k * a_dim1]);
	    wa[k] = rdiag[k];
L80:
/* L90: */
	    ;
	}
L100:
	rdiag[j] = -ajnorm;
/* L110: */
    }
    return;

/*     last card of subroutine qrfac. */

}